

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  ImGuiID IVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ImGuiTabItem *pIVar6;
  float fVar7;
  float fVar8;
  ImGuiTabItemFlags IVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  ImGuiTabItem *pIVar17;
  ulong uVar18;
  ImGuiTabItem *unaff_R14;
  ImGuiTabItem *pIVar19;
  bool bVar20;
  ImGuiTabItem item_tmp;
  undefined3 uStack_2b;
  undefined5 uStack_28;
  
  IVar1 = tab_bar->ReorderRequestTabId;
  if (IVar1 != 0) {
    uVar15 = (ulong)(tab_bar->Tabs).Size;
    bVar20 = 0 < (long)uVar15;
    if (0 < (long)uVar15) {
      unaff_R14 = (tab_bar->Tabs).Data;
      bVar20 = true;
      if (unaff_R14->ID != IVar1) {
        pIVar17 = unaff_R14 + (uVar15 - 1);
        uVar11 = 1;
        pIVar19 = unaff_R14;
        do {
          uVar18 = uVar11;
          unaff_R14 = pIVar17;
          if (uVar15 == uVar18) break;
          unaff_R14 = pIVar19 + 1;
          pIVar6 = pIVar19 + 1;
          uVar11 = uVar18 + 1;
          pIVar19 = unaff_R14;
        } while (pIVar6->ID != IVar1);
        bVar20 = uVar18 < uVar15;
      }
    }
    if (bVar20) goto LAB_00183ee1;
  }
  unaff_R14 = (ImGuiTabItem *)0x0;
LAB_00183ee1:
  if ((unaff_R14 != (ImGuiTabItem *)0x0) && ((unaff_R14->Flags & 0x20) == 0)) {
    iVar12 = ImGuiTabBar::GetTabOrder(tab_bar,unaff_R14);
    iVar16 = (int)tab_bar->ReorderRequestOffset;
    uVar13 = iVar12 + iVar16;
    if ((-1 < (int)uVar13) && ((int)uVar13 < (tab_bar->Tabs).Size)) {
      pIVar19 = (tab_bar->Tabs).Data;
      uVar2 = pIVar19[uVar13].Flags;
      if (((uVar2 & 0x20) == 0) && (((uVar2 ^ unaff_R14->Flags) & 0xc0) == 0)) {
        pIVar19 = pIVar19 + uVar13;
        uVar3._0_2_ = unaff_R14->BeginOrder;
        uVar3._2_2_ = unaff_R14->IndexDuringLayout;
        uVar3._4_1_ = unaff_R14->WantClose;
        uVar3._5_3_ = *(undefined3 *)&unaff_R14->field_0x25;
        uStack_28 = (undefined5)uVar3;
        IVar1 = unaff_R14->ID;
        IVar9 = unaff_R14->Flags;
        iVar12 = unaff_R14->LastFrameVisible;
        iVar10 = unaff_R14->LastFrameSelected;
        fVar7 = unaff_R14->Offset;
        fVar8 = unaff_R14->Width;
        uVar4 = unaff_R14->ContentWidth;
        uVar5 = unaff_R14->NameOffset;
        uStack_2b = (undefined3)((uint)uVar5 >> 8);
        pIVar17 = pIVar19 + 1;
        pIVar6 = pIVar19;
        if (0 < tab_bar->ReorderRequestOffset) {
          pIVar17 = unaff_R14;
          pIVar6 = unaff_R14 + 1;
        }
        iVar14 = -iVar16;
        if (0 < iVar16) {
          iVar14 = iVar16;
        }
        memmove(pIVar17,pIVar6,(ulong)(uint)(iVar14 << 3) * 5);
        *(ulong *)((long)&pIVar19->NameOffset + 1) = CONCAT53(uStack_28,uStack_2b);
        pIVar19->Offset = fVar7;
        pIVar19->Width = fVar8;
        pIVar19->ContentWidth = (float)uVar4;
        pIVar19->NameOffset = uVar5;
        pIVar19->ID = IVar1;
        pIVar19->Flags = IVar9;
        pIVar19->LastFrameVisible = iVar12;
        pIVar19->LastFrameSelected = iVar10;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestOffset;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered tabs must share the same section
    // (Note: TabBarQueueReorderFromMousePos() also has a similar test but since we allow direct calls to TabBarQueueReorder() we do it here too)
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & ImGuiTabItemFlags_SectionMask_) != (tab2->Flags & ImGuiTabItemFlags_SectionMask_))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    ImGuiTabItem* src_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 + 1 : tab2;
    ImGuiTabItem* dst_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 : tab2 + 1;
    const int move_count = (tab_bar->ReorderRequestOffset > 0) ? tab_bar->ReorderRequestOffset : -tab_bar->ReorderRequestOffset;
    memmove(dst_tab, src_tab, move_count * sizeof(ImGuiTabItem));
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}